

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

void Curl_freeset(SessionHandle *data)

{
  char *pcVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    pcVar1 = (data->set).str[lVar2];
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
      (data->set).str[lVar2] = (char *)0x0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x26);
  if ((data->change).referer_alloc == true) {
    pcVar1 = (data->change).referer;
    if (pcVar1 != (char *)0x0) {
      (*Curl_cfree)(pcVar1);
    }
    (data->change).referer_alloc = false;
  }
  (data->change).referer = (char *)0x0;
  return;
}

Assistant:

void Curl_freeset(struct SessionHandle * data)
{
  /* Free all dynamic strings stored in the data->set substructure. */
  enum dupstring i;
  for(i=(enum dupstring)0; i < STRING_LAST; i++)
    Curl_safefree(data->set.str[i]);

  if(data->change.referer_alloc) {
    Curl_safefree(data->change.referer);
    data->change.referer_alloc = FALSE;
  }
  data->change.referer = NULL;
}